

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O2

void Acb_ObjMarkTfo_rec(Acb_Ntk_t *p,int iObj,int nTfoLevMax,int nFanMax,Vec_Int_t *vMarked)

{
  int iVar1;
  int i;
  Acb_ObjType_t AVar2;
  Vec_Int_t *pVVar3;
  
  iVar1 = Acb_ObjSetTravIdCur(p,iObj);
  if (iVar1 == 0) {
    Vec_IntPush(vMarked,iObj);
    iVar1 = Acb_ObjLevelD(p,iObj);
    if (iVar1 <= nTfoLevMax) {
      iVar1 = Acb_ObjFanoutNum(p,iObj);
      if (iVar1 <= nFanMax) {
        iVar1 = 0;
        while( true ) {
          pVVar3 = Vec_WecEntry(&p->vFanouts,iObj);
          if (pVVar3->nSize <= iVar1) break;
          pVVar3 = Vec_WecEntry(&p->vFanouts,iObj);
          i = Vec_IntEntry(pVVar3,iVar1);
          AVar2 = Acb_ObjType(p,i);
          if (AVar2 != ABC_OPER_NONE) {
            Acb_ObjMarkTfo_rec(p,i,nTfoLevMax,nFanMax,vMarked);
          }
          iVar1 = iVar1 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void Acb_ObjMarkTfo_rec( Acb_Ntk_t * p, int iObj, int nTfoLevMax, int nFanMax, Vec_Int_t * vMarked )
{
    int iFanout, i;
    if ( Acb_ObjSetTravIdCur(p, iObj) )
        return;
    Vec_IntPush( vMarked, iObj );
    if ( Acb_ObjLevelD(p, iObj) > nTfoLevMax || Acb_ObjFanoutNum(p, iObj) > nFanMax )
        return;
    Acb_ObjForEachFanout( p, iObj, iFanout, i )
        Acb_ObjMarkTfo_rec( p, iFanout, nTfoLevMax, nFanMax, vMarked );
}